

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void nodeGetCell(Rtree *pRtree,RtreeNode *pNode,int iCell,RtreeCell *pCell)

{
  i64 iVar1;
  RtreeCoord *pCoord;
  ulong uVar2;
  u8 *p;
  
  iVar1 = nodeGetRowid(pRtree,pNode,iCell);
  pCell->iRowid = iVar1;
  p = pNode->zData + (long)iCell * (ulong)pRtree->nBytesPerCell + 0xc;
  pCoord = pCell->aCoord + 1;
  uVar2 = 0;
  do {
    readCoord(p,pCoord + -1);
    readCoord(p + 4,pCoord);
    uVar2 = uVar2 + 2;
    pCoord = pCoord + 2;
    p = p + 8;
  } while (uVar2 < pRtree->nDim2);
  return;
}

Assistant:

static void nodeGetCell(
  Rtree *pRtree,               /* The overall R-Tree */
  RtreeNode *pNode,            /* The node containing the cell to be read */
  int iCell,                   /* Index of the cell within the node */
  RtreeCell *pCell             /* OUT: Write the cell contents here */
){
  u8 *pData;
  RtreeCoord *pCoord;
  int ii = 0;
  pCell->iRowid = nodeGetRowid(pRtree, pNode, iCell);
  pData = pNode->zData + (12 + pRtree->nBytesPerCell*iCell);
  pCoord = pCell->aCoord;
  do{
    readCoord(pData, &pCoord[ii]);
    readCoord(pData+4, &pCoord[ii+1]);
    pData += 8;
    ii += 2;
  }while( ii<pRtree->nDim2 );
}